

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_Common.cpp
# Opt level: O1

void nullcDumpStackData(void)

{
  ExternTypeInfo *pEVar1;
  uint uVar2;
  long lVar3;
  ExternLocalInfo *pEVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  void *pvVar8;
  ExternVarInfo *pEVar9;
  ExternTypeInfo *pEVar10;
  char *pcVar11;
  ExternFuncInfo *pEVar12;
  int iVar13;
  undefined8 *puVar14;
  uint *puVar15;
  ulong uVar16;
  uint variableCount;
  uint functionCount;
  uint codeTypeCount;
  uint dataCount;
  char buf [1024];
  uint local_4ac;
  uint local_494;
  long local_490;
  void *local_488;
  ExternFuncInfo *local_480;
  uint local_478;
  uint local_474;
  ExternLocalInfo *local_470;
  ExternTypeInfo *local_468;
  ExternLocalInfo *local_460;
  uint *local_458;
  ExternFuncInfo *local_450;
  ulong local_448;
  uint local_440 [2];
  char local_438 [1032];
  
  local_440[1] = 0xffffffff;
  pvVar8 = nullcGetVariableData(local_440 + 1);
  local_494 = 0;
  pEVar9 = nullcDebugVariableInfo(&local_494);
  local_440[0] = 0;
  pEVar10 = nullcDebugTypeInfo(local_440);
  local_474 = 0;
  local_450 = nullcDebugFunctionInfo(&local_474);
  local_460 = nullcDebugLocalInfo((uint *)0x0);
  pcVar11 = nullcDebugSymbols((uint *)0x0);
  nullcDebugBeginCallStack();
  local_458 = &pEVar9->offset;
  local_4ac = 0;
  local_488 = pvVar8;
  do {
    uVar5 = nullcDebugGetStackFrame();
    if (uVar5 != 0) {
      PrintStackFrame(uVar5,local_438,0x400,false);
      printf("%s",local_438);
      local_478 = uVar5;
      pEVar12 = nullcDebugConvertAddressToFunction(uVar5,local_450,local_474);
      if (pEVar12 == (ExternFuncInfo *)0x0) {
        uVar5 = local_478;
        if (local_494 != 0) {
          uVar16 = 0;
          puVar15 = local_458;
          do {
            uVar5 = puVar15[-1];
            printf("  ");
            pEVar1 = pEVar10 + uVar5;
            printf("%p: %s %s",(ulong)*puVar15 + (long)pvVar8,pcVar11 + pEVar10[uVar5].offsetToName,
                   pcVar11 + ((ExternVarInfo *)(puVar15 + -3))->offsetToName);
            if ((pEVar10[uVar5].subCat & ~CAT_POINTER) == CAT_NONE) {
              printf(" = ");
              nullcPrintBasicVariableInfo(pEVar1,(char *)((ulong)*puVar15 + (long)pvVar8));
              putchar(10);
            }
            else {
              iVar13 = strcmp(pcVar11 + pEVar1->offsetToName,"typeid");
              if (iVar13 == 0) {
                printf(" = %s\n",
                       pcVar11 + pEVar10[*(int *)((long)pvVar8 + (ulong)*puVar15)].offsetToName);
              }
              else {
                putchar(10);
                nullcPrintVariableInfo(pEVar1,(char *)((ulong)*puVar15 + (long)pvVar8),2);
              }
            }
            uVar5 = pEVar1->size + *puVar15;
            if (local_4ac < uVar5) {
              local_4ac = uVar5;
            }
            uVar16 = uVar16 + 1;
            puVar15 = puVar15 + 4;
            uVar5 = local_478;
          } while (uVar16 < local_494);
        }
      }
      else {
        iVar13 = 0x10 - (local_4ac & 0xf);
        if ((local_4ac & 0xf) == 0) {
          iVar13 = 0;
        }
        local_448 = (ulong)(iVar13 + local_4ac);
        local_490 = local_448 + (long)pvVar8;
        printf("%p: function %s(",local_490,pcVar11 + pEVar12->offsetToName);
        if (pEVar12->paramCount != 0) {
          uVar5 = 0;
          do {
            uVar6 = pEVar12->offsetToFirstLocal + uVar5;
            printf("%s %s",pcVar11 + pEVar10[local_460[uVar6].type].offsetToName,
                   pcVar11 + local_460[uVar6].offsetToName);
            if (uVar5 != pEVar12->paramCount - 1) {
              printf(", ");
            }
            uVar5 = uVar5 + 1;
          } while (uVar5 < pEVar12->paramCount);
        }
        uVar5 = pEVar12->stackSize;
        printf(") argument size %u, stack size %u\n",(ulong)pEVar12->argumentSize);
        if (pEVar12->localCount != 0) {
          uVar6 = 0;
          local_480 = pEVar12;
          do {
            pEVar4 = local_460;
            uVar7 = local_480->offsetToFirstLocal + uVar6;
            local_470 = local_460 + uVar7;
            uVar2 = local_460[uVar7].type;
            printf("  ");
            lVar3 = local_490;
            local_468 = pEVar10 + uVar2;
            printf("%p: %s %s",(ulong)pEVar4[uVar7].offset + local_490,
                   pcVar11 + pEVar10[pEVar4[uVar7].type].offsetToName);
            pEVar1 = local_468;
            pEVar4 = local_470;
            if ((pEVar10[uVar2].subCat & ~CAT_POINTER) == CAT_NONE) {
              printf(" = ");
              nullcPrintBasicVariableInfo(local_468,(char *)((ulong)local_470->offset + lVar3));
              putchar(10);
            }
            else {
              iVar13 = strcmp(pcVar11 + local_468->offsetToName,"typeid");
              if (iVar13 == 0) {
                printf(" = %s\n",
                       pcVar11 + pEVar10[*(int *)(local_490 + (ulong)pEVar4->offset)].offsetToName);
              }
              else {
                putchar(10);
                nullcPrintVariableInfo(pEVar1,(char *)((ulong)pEVar4->offset + local_490),2);
              }
            }
            uVar6 = uVar6 + 1;
            pEVar12 = local_480;
            pvVar8 = local_488;
          } while (uVar6 < local_480->localCount);
        }
        lVar3 = local_490;
        if (pEVar12->parentType != 0xffffffff) {
          uVar6 = pEVar12->argumentSize;
          printf("  ");
          puVar14 = (undefined8 *)(lVar3 + (ulong)uVar6 + -8);
          printf("%p: %s %s = %p\n",puVar14,"$this",
                 pcVar11 + pEVar10[pEVar12->parentType].offsetToName,*puVar14);
        }
        if (pEVar12->contextType != 0xffffffff) {
          uVar6 = pEVar12->argumentSize;
          printf("  ");
          puVar14 = (undefined8 *)(lVar3 + (ulong)uVar6 + -8);
          printf("%p: %s %s = %p\n",puVar14,"$context",
                 pcVar11 + pEVar10[pEVar12->contextType].offsetToName,*puVar14);
        }
        local_4ac = (uVar5 + 0xf & 0xfffffff0) + (int)local_448;
        uVar5 = local_478;
      }
    }
  } while (uVar5 != 0);
  return;
}

Assistant:

void nullcDumpStackData()
{
	unsigned dataCount = ~0u;
	char *data = (char*)nullcGetVariableData(&dataCount);

	unsigned variableCount = 0;
	ExternVarInfo *codeVars = nullcDebugVariableInfo(&variableCount);

	unsigned codeTypeCount = 0;
	ExternTypeInfo *codeTypes = nullcDebugTypeInfo(&codeTypeCount);

	unsigned functionCount = 0;
	ExternFuncInfo *codeFunctions = nullcDebugFunctionInfo(&functionCount);

	ExternLocalInfo *codeLocals = nullcDebugLocalInfo(NULL);
	char *codeSymbols = nullcDebugSymbols(NULL);

	unsigned offset = 0;

	nullcDebugBeginCallStack();
	while(unsigned address = nullcDebugGetStackFrame())
	{
		char buf[1024];
		PrintStackFrame(address, buf, 1024, false);

		printf("%s", buf);

		ExternFuncInfo *func = nullcDebugConvertAddressToFunction(address, codeFunctions, functionCount);

		unsigned indent = 1;

		if(func)
		{
			ExternFuncInfo &function = *func;

			// Align offset to the first variable (by 16 byte boundary)
			int alignOffset = (offset % 16 != 0) ? (16 - (offset % 16)) : 0;
			offset += alignOffset;

			printf("%p: function %s(", (void*)(data + offset), codeSymbols + function.offsetToName);
			for(unsigned arg = 0; arg < function.paramCount; arg++)
			{
				ExternLocalInfo &lInfo = codeLocals[function.offsetToFirstLocal + arg];
				printf("%s %s", codeSymbols + codeTypes[lInfo.type].offsetToName, codeSymbols + lInfo.offsetToName);
				if(arg != function.paramCount - 1)
					printf(", ");
			}

			unsigned argumentsSize = function.argumentSize;
			unsigned stackSize = (function.stackSize + 0xf) & ~0xf;

			printf(") argument size %u, stack size %u\n", argumentsSize, stackSize);

			for(unsigned i = 0; i < function.localCount; i++)
			{
				ExternLocalInfo &lInfo = codeLocals[function.offsetToFirstLocal + i];
				ExternTypeInfo &localType = codeTypes[lInfo.type];

				nullcPrintDepthIndent(indent);
				printf("%p: %s %s", (void*)(data + offset + lInfo.offset), codeSymbols + codeTypes[lInfo.type].offsetToName, codeSymbols + lInfo.offsetToName);

				if(localType.subCat == ExternTypeInfo::CAT_NONE || localType.subCat == ExternTypeInfo::CAT_POINTER)
				{
					printf(" = ");
					nullcPrintBasicVariableInfo(localType, data + offset + lInfo.offset);
					printf("\n");
				}
				else if(strcmp(codeSymbols + localType.offsetToName, "typeid") == 0)
				{
					printf(" = %s\n", codeSymbols + codeTypes[*(int*)(data + offset + lInfo.offset)].offsetToName);
				}
				else
				{
					printf("\n");
					nullcPrintVariableInfo(localType, data + offset + lInfo.offset, indent + 1);
				}
			}

			if(function.parentType != ~0u)
			{
				char *ptr = (char*)(data + offset + function.argumentSize - NULLC_PTR_SIZE);

				nullcPrintDepthIndent(indent);
				printf("%p: %s %s = %p\n", (void*)ptr, "$this", codeSymbols + codeTypes[function.parentType].offsetToName, *(void**)ptr);
			}

			if(function.contextType != ~0u)
			{
				char *ptr = (char*)(data + offset + function.argumentSize - NULLC_PTR_SIZE);

				nullcPrintDepthIndent(indent);
				printf("%p: %s %s = %p\n", (void*)ptr, "$context", codeSymbols + codeTypes[function.contextType].offsetToName, *(void**)ptr);
			}

			offset += stackSize;
		}
		else
		{
			for(unsigned i = 0; i < variableCount; i++)
			{
				ExternTypeInfo &type = codeTypes[codeVars[i].type];

				nullcPrintDepthIndent(indent);
				printf("%p: %s %s", (void*)(data + codeVars[i].offset), codeSymbols + type.offsetToName, codeSymbols + codeVars[i].offsetToName);

				if(type.subCat == ExternTypeInfo::CAT_NONE || type.subCat == ExternTypeInfo::CAT_POINTER)
				{
					printf(" = ");
					nullcPrintBasicVariableInfo(type, data + codeVars[i].offset);
					printf("\n");
				}
				else if(strcmp(codeSymbols + type.offsetToName, "typeid") == 0)
				{
					printf(" = %s\n", codeSymbols + codeTypes[*(int*)(data + codeVars[i].offset)].offsetToName);
				}
				else
				{
					printf("\n");
					nullcPrintVariableInfo(type, data + codeVars[i].offset, indent + 1);
				}

				if(codeVars[i].offset + type.size > offset)
					offset = codeVars[i].offset + type.size;
			}
		}
	}
}